

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

bool wasm::Debug::hasDWARFSections(Module *wasm)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  undefined1 in_CL;
  pointer pCVar4;
  bool bVar5;
  string_view s;
  string_view s_00;
  string_view local_40;
  
  pCVar1 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = pCVar1 != pCVar2;
  if (bVar5) {
    s._M_str = (char *)0x0;
    s._M_len = (size_t)(pCVar1->name)._M_dataplus._M_p;
    local_40 = IString::interned((IString *)(pCVar1->name)._M_string_length,s,(bool)in_CL);
    bVar3 = IString::startsWith<8>((IString *)&local_40,(char (*) [8])".debug_");
    if (!bVar3) {
      do {
        pCVar4 = pCVar1 + 1;
        bVar5 = pCVar4 != pCVar2;
        if (pCVar4 == pCVar2) {
          return bVar5;
        }
        s_00._M_str = (char *)0x0;
        s_00._M_len = (size_t)(pCVar4->name)._M_dataplus._M_p;
        local_40 = IString::interned((IString *)pCVar1[1].name._M_string_length,s_00,(bool)in_CL);
        bVar3 = IString::startsWith<8>((IString *)&local_40,(char (*) [8])".debug_");
        pCVar1 = pCVar4;
      } while (!bVar3);
    }
  }
  return bVar5;
}

Assistant:

bool hasDWARFSections(const Module& wasm) {
  for (auto& section : wasm.customSections) {
    if (isDWARFSection(section.name)) {
      return true;
    }
  }
  return false;
}